

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveCreate(Parser *parser,int flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  CDirectiveFile *this;
  undefined4 in_register_00000034;
  int64_t memoryAddress;
  StringLiteral inputName;
  vector<Expression,_std::allocator<Expression>_> list;
  int64_t local_80;
  StringLiteral local_78;
  vector<Expression,_std::allocator<Expression>_> local_58;
  path local_38;
  
  local_58.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (Expression *)0x0;
  local_58.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = Parser::parseExpressionList((Parser *)CONCAT44(in_register_00000034,flags),&local_58,2,2);
  if (!bVar2) {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    goto LAB_0017c129;
  }
  paVar1 = &local_78._value.field_2;
  local_78._value._M_string_length = 0;
  local_78._value.field_2._M_local_buf[0] = '\0';
  local_78._value._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = Expression::evaluateString
                    (local_58.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_78,false);
  if (bVar2) {
    bVar2 = Expression::evaluateInteger<long>
                      (local_58.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                       super__Vector_impl_data._M_finish + -1,&local_80);
    if (!bVar2) goto LAB_0017c10c;
    this = (CDirectiveFile *)operator_new(0x40);
    CDirectiveFile::CDirectiveFile(this);
    StringLiteral::path(&local_38,&local_78);
    CDirectiveFile::initCreate(this,&local_38,local_80);
    ghc::filesystem::path::~path(&local_38);
  }
  else {
LAB_0017c10c:
    this = (CDirectiveFile *)0x0;
  }
  (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._value._M_dataplus._M_p,
                    CONCAT71(local_78._value.field_2._M_allocated_capacity._1_7_,
                             local_78._value.field_2._M_local_buf[0]) + 1);
  }
LAB_0017c129:
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&local_58);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveCreate(Parser& parser, int flags)
{
	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,2,2))
		return nullptr;

	int64_t memoryAddress;
	StringLiteral inputName;

	if (!list[0].evaluateString(inputName,false))
		return nullptr;

	if (!list.back().evaluateInteger(memoryAddress))
		return nullptr;

	auto file = std::make_unique<CDirectiveFile>();
	file->initCreate(inputName.path(),memoryAddress);
	return file;
}